

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::anon_unknown_0::Disassembler::SaveTextResult(Disassembler *this,spv_text *text_result)

{
  spv_text in_RAX;
  char *__dest;
  char *local_50;
  size_t local_48;
  
  if (this->print_ == false) {
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_dispose();
    __dest = (char *)operator_new__(local_48 + 1);
    std::__cxx11::stringbuf::str();
    strncpy(__dest,local_50,local_48 + 1);
    std::__cxx11::string::_M_dispose();
    in_RAX = (spv_text)operator_new(0x10);
    in_RAX->str = __dest;
    in_RAX->length = local_48;
    *text_result = in_RAX;
  }
  return (spv_result_t)in_RAX;
}

Assistant:

spv_result_t Disassembler::SaveTextResult(spv_text* text_result) const {
  if (!print_) {
    size_t length = text_.str().size();
    char* str = new char[length + 1];
    if (!str) return SPV_ERROR_OUT_OF_MEMORY;
    strncpy(str, text_.str().c_str(), length + 1);
    spv_text text = new spv_text_t();
    if (!text) {
      delete[] str;
      return SPV_ERROR_OUT_OF_MEMORY;
    }
    text->str = str;
    text->length = length;
    *text_result = text;
  }
  return SPV_SUCCESS;
}